

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O2

int Fxch_TabSingleDivisors(Fxch_Man_t *p,int iCube,int fAdd)

{
  int Lit0;
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  int i;
  
  p_00 = Vec_WecEntry(&p->vCubes,iCube);
  iVar1 = p_00->nSize;
  iVar3 = 0;
  if (1 < iVar1) {
    iVar3 = 0;
    while (iVar3 < iVar1) {
      Lit0 = Vec_IntEntry(p_00,iVar3);
      iVar3 = iVar3 + 1;
      for (i = iVar3; iVar1 = p_00->nSize, i < iVar1; i = i + 1) {
        iVar1 = Vec_IntEntry(p_00,i);
        if (iVar1 <= Lit0) {
          __assert_fail("Lit < Lit2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                        ,0x22f,"int Fxch_TabSingleDivisors(Fxch_Man_t *, int, int)");
        }
        iVar2 = 1;
        if (fAdd == 0) {
          Fxch_DivisorRemove(p,Lit0,iVar1,1);
          iVar2 = -1;
        }
        else {
          Fxch_DivisorAdd(p,Lit0,iVar1,1);
        }
        p->nPairsS = p->nPairsS + iVar2;
      }
    }
    iVar3 = ((iVar1 + -1) * iVar1) / 2;
  }
  return iVar3;
}

Assistant:

int Fxch_TabSingleDivisors( Fxch_Man_t * p, int iCube, int fAdd )
{
    Vec_Int_t * vCube = Vec_WecEntry( &p->vCubes, iCube );
    int i, k, Lit, Lit2;
    if ( Vec_IntSize(vCube) < 2 )
        return 0;
    Vec_IntForEachEntry( vCube, Lit, i )
    Vec_IntForEachEntryStart( vCube, Lit2, k, i+1 )
    {
        assert( Lit < Lit2 );
        if ( fAdd )
            Fxch_DivisorAdd( p, Lit, Lit2, 1 ), p->nPairsS++;
        else
            Fxch_DivisorRemove( p, Lit, Lit2, 1 ), p->nPairsS--;
    }
    return Vec_IntSize(vCube) * (Vec_IntSize(vCube) - 1) / 2;
}